

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::AdvancedSSOSimple::Setup(AdvancedSSOSimple *this)

{
  CallLogWrapper *this_00;
  GLuint GVar1;
  long lStack_20;
  
  this->c_program = 0;
  this->m_buffer = 0;
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_texture);
  if (this->pipeline == true) {
    glu::CallLogWrapper::glGenProgramPipelines(this_00,2,this->m_pipeline);
    GVar1 = ShaderImageLoadStoreBase::BuildShaderProgram
                      (&this->super_ShaderImageLoadStoreBase,0x8b31,
                       "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                      );
    this->m_vsp = GVar1;
    GVar1 = ShaderImageLoadStoreBase::BuildShaderProgram
                      (&this->super_ShaderImageLoadStoreBase,0x8b30,
                       "\nlayout(rgba32f, binding = 2) writeonly uniform image2D g_image[2];\nvoid main() {\n  int i = g_image.length();\n  imageStore(g_image[0], ivec2(gl_FragCoord), vec4(i+98));\n  imageStore(g_image[1], ivec2(gl_FragCoord), vec4(i+99));\n  discard;\n}"
                      );
    this->m_fsp0 = GVar1;
    GVar1 = ShaderImageLoadStoreBase::BuildShaderProgram
                      (&this->super_ShaderImageLoadStoreBase,0x8b30,
                       "\nlayout(rgba32f, binding = 0) writeonly uniform image2D g_image[2];\nvoid main() {\n  int i = g_image.length();\n  imageStore(g_image[0], ivec2(gl_FragCoord), vec4(i+8));\n  imageStore(g_image[1], ivec2(gl_FragCoord), vec4(i+9));\n  discard;\n}"
                      );
    lStack_20 = 0x40;
  }
  else {
    GVar1 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,
                       "\nlayout(rgba32f, binding = 2) writeonly uniform image2D g_image[2];\nvoid main() {\n  int i = g_image.length();\n  imageStore(g_image[0], ivec2(gl_FragCoord), vec4(i+98));\n  imageStore(g_image[1], ivec2(gl_FragCoord), vec4(i+99));\n  discard;\n}"
                       ,false,false);
    this->m_program[0] = GVar1;
    GVar1 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,
                       "\nlayout(rgba32f, binding = 0) writeonly uniform image2D g_image[2];\nvoid main() {\n  int i = g_image.length();\n  imageStore(g_image[0], ivec2(gl_FragCoord), vec4(i+8));\n  imageStore(g_image[1], ivec2(gl_FragCoord), vec4(i+9));\n  discard;\n}"
                       ,false,false);
    lStack_20 = 0x50;
  }
  *(GLuint *)((long)this->m_pipeline + lStack_20 + -0x30) = GVar1;
  return 0;
}

Assistant:

virtual long Setup()
	{
		c_program = 0;
		m_buffer  = 0;
		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);
		glGenTextures(1, &m_texture);
		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		const char* const glsl_fs0 =
			NL "layout(rgba32f, binding = 2) writeonly uniform image2D g_image[2];" NL "void main() {" NL
			   "  int i = g_image.length();" NL "  imageStore(g_image[0], ivec2(gl_FragCoord), vec4(i+98));" NL
			   "  imageStore(g_image[1], ivec2(gl_FragCoord), vec4(i+99));" NL "  discard;" NL "}";
		const char* const glsl_fs1 =
			NL "layout(rgba32f, binding = 0) writeonly uniform image2D g_image[2];" NL "void main() {" NL
			   "  int i = g_image.length();" NL "  imageStore(g_image[0], ivec2(gl_FragCoord), vec4(i+8));" NL
			   "  imageStore(g_image[1], ivec2(gl_FragCoord), vec4(i+9));" NL "  discard;" NL "}";
		if (pipeline)
		{
			glGenProgramPipelines(2, m_pipeline);
			m_vsp  = BuildShaderProgram(GL_VERTEX_SHADER, glsl_vs);
			m_fsp0 = BuildShaderProgram(GL_FRAGMENT_SHADER, glsl_fs0);
			m_fsp1 = BuildShaderProgram(GL_FRAGMENT_SHADER, glsl_fs1);
		}
		else
		{
			m_program[0] = BuildProgram(glsl_vs, glsl_fs0);
			m_program[1] = BuildProgram(glsl_vs, glsl_fs1);
		}
		return NO_ERROR;
	}